

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottie2gif.cpp
# Opt level: O2

int __thiscall App::setup(App *this,int argc,char **argv,size_t *width,size_t *height)

{
  char *__s;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  allocator local_13e9;
  char *local_13e8;
  App *local_13e0;
  undefined1 local_13d8 [32];
  array<char,_5000UL> memory;
  
  *height = 200;
  *width = 200;
  if (1 < argc) {
    pcVar3 = argv[1];
    if (argc != 2) {
      __s = argv[2];
      local_13e8 = pcVar3;
      local_13e0 = this;
      pcVar3 = strchr(__s,0x78);
      if (pcVar3 != (char *)0x0) {
        snprintf(memory._M_elems,(size_t)(pcVar3 + (1 - (long)__s)),"%s",__s);
        iVar2 = atoi(memory._M_elems);
        *width = (long)iVar2;
        snprintf(memory._M_elems,0x14,"%s",pcVar3 + 1);
        iVar2 = atoi(memory._M_elems);
        *height = (long)iVar2;
      }
      this = local_13e0;
      pcVar3 = local_13e8;
      if (3 < (uint)argc) {
        lVar4 = strtol(argv[3],(char **)0x0,0x10);
        this->bgColor = (int)lVar4;
      }
    }
    if (pcVar3 != (char *)0x0) {
      pcVar3 = realpath(pcVar3,memory._M_elems);
      if (pcVar3 != (char *)0x0) {
        std::__cxx11::string::string((string *)local_13d8,pcVar3,&local_13e9);
        std::__cxx11::string::operator=((string *)&this->fileName,(string *)local_13d8);
        std::__cxx11::string::~string((string *)local_13d8);
        bVar1 = jsonFile(this);
        if (bVar1) {
          __xpg_basename((App *)local_13d8,(char *)this);
          std::__cxx11::string::operator=((string *)&this->gifName,(string *)local_13d8);
          std::__cxx11::string::~string((string *)local_13d8);
          std::__cxx11::string::append((char *)&this->gifName);
          return 0;
        }
      }
      iVar2 = help(this);
      return iVar2;
    }
  }
  iVar2 = help(this);
  return iVar2;
}

Assistant:

int setup(int argc, char **argv, size_t *width, size_t *height)
    {
        char *path{nullptr};

        *width = *height = 200;   //default gif size

        if (argc > 1) path = argv[1];
        if (argc > 2) {
            char tmp[20];
            char *x = strstr(argv[2], "x");
            if (x) {
                snprintf(tmp, x - argv[2] + 1, "%s", argv[2]);
                *width = atoi(tmp);
                snprintf(tmp, sizeof(tmp), "%s", x + 1);
                *height = atoi(tmp);
            }
        }
        if (argc > 3) bgColor = strtol(argv[3], NULL, 16);

        if (!path) return help();

        std::array<char, 5000> memory;

#ifdef _WIN32
        path = _fullpath(memory.data(), path, memory.size());
#else
        path = realpath(path, memory.data());
#endif
        if (!path) return help();

        fileName = std::string(path);

        if (!jsonFile()) return help();

        gifName = basename(fileName);
        gifName.append(".gif");
        return 0;
    }